

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall google::protobuf::TextFormat::Printer::TextGenerator::Outdent(TextGenerator *this)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  TextGenerator *local_10;
  TextGenerator *this_local;
  
  if ((this->indent_level_ == 0) || (this->indent_level_ < this->initial_indent_level_)) {
    local_10 = this;
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x5ab);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [38])" Outdent() without matching Indent().");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_28);
  }
  else {
    this->indent_level_ = this->indent_level_ + -1;
  }
  return;
}

Assistant:

void Outdent() override {
    if (indent_level_ == 0 || indent_level_ < initial_indent_level_) {
      ABSL_DLOG(FATAL) << " Outdent() without matching Indent().";
      return;
    }

    --indent_level_;
  }